

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AstCompiler.cpp
# Opt level: O2

bool __thiscall
compiler::EmissionContext::GetDeclarationIndex
          (EmissionContext *this,string *var,size_t *index,bool considerPartiallyBound)

{
  __type _Var1;
  reference pvVar2;
  size_t __n;
  
  __n = this->firstFreeVariablesIndex;
  do {
    do {
      __n = __n - 1;
      if (__n == 0xffffffffffffffff) goto LAB_0011f2b9;
      pvVar2 = std::
               vector<compiler::VariableDeclaration,_std::allocator<compiler::VariableDeclaration>_>
               ::at(&this->variables,__n);
    } while ((pvVar2->isFullyBound | considerPartiallyBound) != 1);
    pvVar2 = std::
             vector<compiler::VariableDeclaration,_std::allocator<compiler::VariableDeclaration>_>::
             at(&this->variables,__n);
    _Var1 = std::operator==(&pvVar2->value,var);
  } while (!_Var1);
  *index = __n;
LAB_0011f2b9:
  return __n != 0xffffffffffffffff;
}

Assistant:

bool GetDeclarationIndex(const std::string & var, std::size_t& index, bool considerPartiallyBound) {

    for (std::size_t i = this->firstFreeVariablesIndex; i-- > 0;) {
      if (!variables.at(i).isFullyBound && !considerPartiallyBound) {
        continue;
      }

      if (variables.at(i).value == var) {
        index = i;
        return true;
      }
    }

    return false;
  }